

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O3

void __thiscall leveldb::CorruptionTest::Reopen(CorruptionTest *this)

{
  AssertHelper *this_00;
  _func_int **message;
  undefined1 local_30 [16];
  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> local_20 [8];
  Env *local_18;
  
  TryReopen((CorruptionTest *)local_30);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            (local_20,local_30 + 8,(Status *)"TryReopen()");
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__((void *)local_30._0_8_);
  }
  if (local_20[0] == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
    testing::Message::Message((Message *)local_30);
    if (local_18 == (Env *)0x0) {
      message = (_func_int **)0x161dc5;
    }
    else {
      message = local_18->_vptr_Env;
    }
    this_00 = (AssertHelper *)(local_30 + 8);
    testing::internal::AssertHelper::AssertHelper
              (this_00,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/corruption_test.cc"
               ,0x31,(char *)message);
    testing::internal::AssertHelper::operator=(this_00,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_30._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(_func_int **)local_30._0_8_ + 8))();
    }
  }
  if (local_18 != (Env *)0x0) {
    if ((Env *)local_18->_vptr_Env != local_18 + 2) {
      operator_delete((Env *)local_18->_vptr_Env);
    }
    operator_delete(local_18);
  }
  return;
}

Assistant:

void Reopen() { ASSERT_LEVELDB_OK(TryReopen()); }